

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O2

void duckdb::Vector::DebugTransformToDictionary(Vector *vector,idx_t count)

{
  sel_t sVar1;
  idx_t iVar2;
  idx_t iVar3;
  bool bVar4;
  SelectionVector original_sel;
  SelectionVector inverted_sel;
  Vector inverted_vector;
  
  if (vector->vector_type == FLAT_VECTOR) {
    iVar3 = count * 2;
    SelectionVector::SelectionVector(&inverted_sel,iVar3);
    sVar1 = (sel_t)count;
    for (iVar2 = 0; sVar1 = sVar1 - 1, iVar2 != count; iVar2 = iVar2 + 1) {
      inverted_sel.sel_vector[iVar2 * 2] = sVar1;
      inverted_sel.sel_vector[iVar2 * 2 + 1] = sVar1;
    }
    Vector(&inverted_vector,vector,&inverted_sel,iVar3);
    Flatten(&inverted_vector,iVar3);
    iVar2 = 0;
    iVar3 = count;
    while (bVar4 = iVar3 != 0, iVar3 = iVar3 - 1, bVar4) {
      FlatVector::SetNull(&inverted_vector,iVar2,true);
      iVar2 = iVar2 + 2;
    }
    SelectionVector::SelectionVector(&original_sel,count);
    sVar1 = (sel_t)count * 2 - 1;
    for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
      original_sel.sel_vector[iVar3] = sVar1;
      sVar1 = sVar1 - 2;
    }
    Slice(vector,&inverted_vector,&original_sel,count);
    FlatVector::IncrementalSelectionVector();
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&original_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ~Vector(&inverted_vector);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&inverted_sel.selection_data.internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  return;
}

Assistant:

void Vector::DebugTransformToDictionary(Vector &vector, idx_t count) {
	if (vector.GetVectorType() != VectorType::FLAT_VECTOR) {
		// only supported for flat vectors currently
		return;
	}
	// convert vector to dictionary vector
	// first create an inverted vector of twice the size with NULL values every other value
	// i.e. [1, 2, 3] is converted into [NULL, 3, NULL, 2, NULL, 1]
	idx_t verify_count = count * 2;
	SelectionVector inverted_sel(verify_count);
	idx_t offset = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t current_index = count - i - 1;
		inverted_sel.set_index(offset++, current_index);
		inverted_sel.set_index(offset++, current_index);
	}
	Vector inverted_vector(vector, inverted_sel, verify_count);
	inverted_vector.Flatten(verify_count);
	// now insert the NULL values at every other position
	for (idx_t i = 0; i < count; i++) {
		FlatVector::SetNull(inverted_vector, i * 2, true);
	}
	// construct the selection vector pointing towards the original values
	// we start at the back, (verify_count - 1) and move backwards
	SelectionVector original_sel(count);
	offset = 0;
	for (idx_t i = 0; i < count; i++) {
		original_sel.set_index(offset++, verify_count - 1 - i * 2);
	}
	// now slice the inverted vector with the inverted selection vector
	vector.Slice(inverted_vector, original_sel, count);
	vector.Verify(count);
}